

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# area_light.h
# Opt level: O2

void __thiscall CGL::GLScene::AreaLight::render_debugger_node(AreaLight *this)

{
  bool bVar1;
  
  bVar1 = ImGui::TreeNode(this,"Area Light");
  if (bVar1) {
    DragDouble3("Radiance",(double *)&this->spectrum,0.005);
    DragDouble3("Position",(double *)&this->position,0.005);
    DragDouble3("Direction",(double *)&this->direction,0.005);
    DragDouble3("Dimension X",(double *)&this->dim_x,0.005);
    DragDouble3("Dimension Y",(double *)&this->dim_y,0.005);
    ImGui::TreePop();
    return;
  }
  return;
}

Assistant:

void render_debugger_node() {
    if (ImGui::TreeNode(this, "Area Light"))
    {
      DragDouble3("Radiance", &spectrum[0], 0.005);
      DragDouble3("Position", &position[0], 0.005);
      DragDouble3("Direction", &direction[0], 0.005);
      DragDouble3("Dimension X", &dim_x[0], 0.005);
      DragDouble3("Dimension Y", &dim_y[0], 0.005);
      ImGui::TreePop();
    }
  }